

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (AggregateFunctionSet *fun,LogicalType *by_type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1a1;
  LogicalType local_1a0;
  vector<duckdb::LogicalType,_true> local_188;
  LogicalType local_170 [2];
  AggregateFunction local_140;
  
  LogicalType::LogicalType(local_170,DECIMAL);
  LogicalType::LogicalType(local_170 + 1,by_type);
  __l._M_len = 2;
  __l._M_array = local_170;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188,__l,
             &local_1a1);
  LogicalType::LogicalType(&local_1a0,DECIMAL);
  AggregateFunction::AggregateFunction
            (&local_140,&local_188,&local_1a0,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,
             (aggregate_update_t)0x0,(aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,
             (aggregate_simple_update_t)0x0,
             BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::LessThan,false>>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01966bf8;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_170[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void AddDecimalArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &by_type) {
	fun.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL, by_type}, LogicalTypeId::DECIMAL, nullptr, nullptr,
	                                  nullptr, nullptr, nullptr, nullptr, BindDecimalArgMinMax<OP>));
}